

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# target.c
# Opt level: O0

stumpless_target * new_target(stumpless_target_type type,char *name)

{
  int iVar1;
  stumpless_target *mem;
  char *pcVar2;
  config_mutex_t *pcVar3;
  stumpless_target *target;
  char *name_local;
  stumpless_target_type type_local;
  
  mem = (stumpless_target *)alloc_mem(0xa0);
  if (mem != (stumpless_target *)0x0) {
    pcVar2 = copy_cstring_with_length(name,&mem->name_length);
    mem->name = pcVar2;
    if (mem->name != (char *)0x0) {
      pcVar3 = thread_safety_new_mutex();
      mem->mutex = pcVar3;
      if (mem->mutex != (void *)0x0) {
        mem->id = (stumpless_id_t)0x0;
        mem->type = type;
        iVar1 = stumpless_get_default_options();
        mem->options = iVar1;
        iVar1 = get_prival(STUMPLESS_FACILITY_USER,STUMPLESS_SEVERITY_INFO);
        mem->default_prival = iVar1;
        mem->default_app_name[0] = '-';
        mem->default_app_name_length = 1;
        mem->default_msgid[0] = '-';
        mem->default_msgid_length = 1;
        mem->mask = 0xff;
        mem->filter = stumpless_mask_filter;
        return mem;
      }
      free_mem(mem->name);
    }
    free_mem(mem);
  }
  return (stumpless_target *)0x0;
}

Assistant:

struct stumpless_target *
new_target( enum stumpless_target_type type, const char *name ) {
  struct stumpless_target *target;

  target = alloc_mem( sizeof( *target ) );
  if( !target ) {
    goto fail;
  }

  target->name = copy_cstring_with_length( name, &target->name_length );
  if( !target->name ) {
    goto fail_name;
  }

  config_assign_cached_mutex( target->mutex );
  if( !config_check_mutex_valid( target->mutex ) ) {
    goto fail_mutex;
  }

  target->id = NULL;
  target->type = type;
  target->options = stumpless_get_default_options(  );
  target->default_prival = get_prival( STUMPLESS_DEFAULT_FACILITY,
                                       STUMPLESS_DEFAULT_SEVERITY );
  target->default_app_name[0] = '-';
  target->default_app_name_length = 1;
  target->default_msgid[0] = '-';
  target->default_msgid_length = 1;
  target->mask = STUMPLESS_SEVERITY_MASK_UPTO( STUMPLESS_SEVERITY_DEBUG_VALUE );
  target->filter = stumpless_mask_filter;

  return target;

fail_mutex:
  free_mem( target->name );
fail_name:
  free_mem( target );
fail:
  return NULL;
}